

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidRandomUniformDistributionWrongMinMax(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  string *psVar4;
  long lVar5;
  ostream *poVar6;
  Result local_118;
  RandomUniformDynamicLayerParams *params3;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  RandomUniformStaticLayerParams *params2;
  Result local_b0;
  RandomUniformLikeLayerParams *params1;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *local_48;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  outShape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)outShape,"output");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)outShape);
  nn = (NeuralNetwork *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,2);
  layers = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)layers,EXACT_ARRAY_MAPPING);
  params1 = (RandomUniformLikeLayerParams *)
            CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)layers);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params1,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params1,"output");
  local_b0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformlike
                 ((NeuralNetworkLayer *)params1);
  CoreML::Specification::RandomUniformLikeLayerParams::set_minval
            ((RandomUniformLikeLayerParams *)local_b0.m_message._M_storage._M_storage,1.2);
  CoreML::Specification::RandomUniformLikeLayerParams::set_maxval
            ((RandomUniformLikeLayerParams *)local_b0.m_message._M_storage._M_storage,0.4);
  CoreML::validate<(MLModelType)500>(&local_b0,(Model *)&in);
  bVar1 = CoreML::Result::good(&local_b0);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1626);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res1).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
    params2._4_4_ = 1;
  }
  else {
    psVar4 = CoreML::Result::message_abi_cxx11_(&local_b0);
    lVar5 = std::__cxx11::string::find((char *)psVar4,0x43cc10);
    if (lVar5 == -1) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1627);
      poVar6 = std::operator<<(poVar6,": error: ");
      poVar6 = std::operator<<(poVar6,"res1.message().find(\"smaller\") != std::string::npos");
      poVar6 = std::operator<<(poVar6," was false, expected true.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
      params2._4_4_ = 1;
    }
    else {
      local_c0._M_storage =
           (uchar  [8])
           CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformstatic
                     ((NeuralNetworkLayer *)params1);
      CoreML::Specification::RandomUniformStaticLayerParams::add_outputshape
                ((RandomUniformStaticLayerParams *)local_c0._M_storage,3);
      CoreML::Specification::RandomUniformStaticLayerParams::set_minval
                ((RandomUniformStaticLayerParams *)local_c0._M_storage,1.2);
      CoreML::Specification::RandomUniformStaticLayerParams::set_maxval
                ((RandomUniformStaticLayerParams *)local_c0._M_storage,0.4);
      CoreML::validate<(MLModelType)500>((Result *)&params3,(Model *)&in);
      bVar1 = CoreML::Result::good((Result *)&params3);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x162f);
        poVar6 = std::operator<<(poVar6,": error: ");
        poVar6 = std::operator<<(poVar6,"!((res2).good())");
        poVar6 = std::operator<<(poVar6," was false, expected true.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
        params2._4_4_ = 1;
      }
      else {
        psVar4 = CoreML::Result::message_abi_cxx11_((Result *)&params3);
        lVar5 = std::__cxx11::string::find((char *)psVar4,0x43cc10);
        if (lVar5 == -1) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar6 = std::operator<<(poVar6,":");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1630);
          poVar6 = std::operator<<(poVar6,": error: ");
          poVar6 = std::operator<<(poVar6,"res2.message().find(\"smaller\") != std::string::npos");
          poVar6 = std::operator<<(poVar6," was false, expected true.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          m._oneof_case_[0] = 1;
          params2._4_4_ = 1;
        }
        else {
          local_118.m_message._M_storage._M_storage =
               (uchar  [8])
               CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformdynamic
                         ((NeuralNetworkLayer *)params1);
          CoreML::Specification::RandomUniformDynamicLayerParams::set_minval
                    ((RandomUniformDynamicLayerParams *)local_118.m_message._M_storage._M_storage,
                     1.2);
          CoreML::Specification::RandomUniformDynamicLayerParams::set_maxval
                    ((RandomUniformDynamicLayerParams *)local_118.m_message._M_storage._M_storage,
                     0.4);
          CoreML::validate<(MLModelType)500>(&local_118,(Model *)&in);
          bVar1 = CoreML::Result::good(&local_118);
          if (bVar1) {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,":");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1637);
            poVar6 = std::operator<<(poVar6,": error: ");
            poVar6 = std::operator<<(poVar6,"!((res3).good())");
            poVar6 = std::operator<<(poVar6," was false, expected true.");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            m._oneof_case_[0] = 1;
          }
          else {
            psVar4 = CoreML::Result::message_abi_cxx11_(&local_118);
            lVar5 = std::__cxx11::string::find((char *)psVar4,0x43cc10);
            if (lVar5 == -1) {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar6 = std::operator<<(poVar6,":");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1638);
              poVar6 = std::operator<<(poVar6,": error: ");
              poVar6 = std::operator<<(poVar6,
                                       "res3.message().find(\"smaller\") != std::string::npos");
              poVar6 = std::operator<<(poVar6," was false, expected true.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              m._oneof_case_[0] = 1;
            }
            else {
              m._oneof_case_[0] = 0;
            }
          }
          params2._4_4_ = 1;
          CoreML::Result::~Result(&local_118);
        }
      }
      CoreML::Result::~Result((Result *)&params3);
    }
  }
  CoreML::Result::~Result(&local_b0);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidRandomUniformDistributionWrongMinMax() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // value of minval should be smaller than value of maxval

    auto* params1 = layers->mutable_randomuniformlike();
    params1->set_minval(1.2f);
    params1->set_maxval(0.4f);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("smaller") != std::string::npos);

    auto* params2 = layers->mutable_randomuniformstatic();
    params2->add_outputshape(3);
    params2->set_minval(1.2f);
    params2->set_maxval(0.4f);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("smaller") != std::string::npos);

    auto* params3 = layers->mutable_randomuniformdynamic();
    params3->set_minval(1.2f);
    params3->set_maxval(0.4f);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("smaller") != std::string::npos);

    return 0;
}